

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::StringPtr&,char_const*>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char **params_1)

{
  char *__s;
  ArrayPtr<const_char> *params_1_00;
  ArrayPtr<const_char> local_38;
  undefined8 local_28;
  ArrayPtr<const_char> *local_20;
  
  local_28 = *(undefined8 *)this;
  params_1_00 = (ArrayPtr<const_char> *)(*(long *)(this + 8) + -1);
  __s = (params->content).ptr;
  local_20 = params_1_00;
  local_38.size_ = strlen(__s);
  local_38.ptr = __s;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,&local_38,params_1_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}